

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::SetOutParamMaxDepth(FunctionBody *this,RegSlot cOutParamsDepth)

{
  uint32 val;
  
  val = 8;
  if (8 < cOutParamsDepth) {
    val = cOutParamsDepth;
  }
  if ((*(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 10 & 1) ==
      0) {
    val = cOutParamsDepth;
  }
  SetCountField(this,OutParamMaxDepth,val);
  return;
}

Assistant:

void
    FunctionBody::SetOutParamMaxDepth(RegSlot cOutParamsDepth)
    {
#if _M_X64
        constexpr RegSlot minAsmJsOutParams = MinAsmJsOutParams();
        if (GetIsAsmJsFunction() && cOutParamsDepth < minAsmJsOutParams)
        {
            cOutParamsDepth = minAsmJsOutParams;
        }
#endif
        SetCountField(CounterFields::OutParamMaxDepth, cOutParamsDepth);
    }